

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O2

QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::FourierMotzkinConf::Lhs> *
__thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::
Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
::next(QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::FourierMotzkinConf::Lhs>
       *__return_storage_ptr__,
      Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
      *this)

{
  char cVar1;
  bool bVar2;
  SelectedSummand *this_00;
  TypedTermList t;
  Renaming normalizer;
  Renaming local_60;
  SmartPtr<Indexing::ResultSubstitution> local_30;
  
  do {
    if ((this->_leafData).
        super_OptionBase<Lib::VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*>_>.
        _isSome == true) {
      cVar1 = (**(code **)(*(long *)(this->_leafData).
                                    super_OptionBase<Lib::VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*>_>
                                    ._elem._elem + 0x10))();
      if (cVar1 != '\0') break;
    }
    bVar2 = findNextLeaf(this);
  } while (bVar2);
  this_00 = (SelectedSummand *)
            (**(code **)(*(long *)(this->_leafData).
                                  super_OptionBase<Lib::VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*>_>
                                  ._elem._elem + 0x18))();
  if (this->_retrieveSubstitution == true) {
    local_60._data._timestamp = 1;
    local_60._data._size = 0;
    local_60._data._deleted = 0;
    local_60._data._capacityIndex = 0;
    local_60._data._capacity = 0;
    local_60._data._20_8_ = 0;
    local_60._data._28_8_ = 0;
    local_60._36_8_ = 0;
    local_60._identity = true;
    t = Kernel::SelectedSummand::key(this_00);
    Kernel::Renaming::normalizeVariables(&local_60,t);
    Lib::Stack<Lib::BacktrackData_*>::push
              ((Stack<Lib::BacktrackData_*> *)this,&this->_normalizationBacktrackData);
    this->_normalizationRecording = true;
    RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>::denormalize
              (&this->_algo,&local_60);
    Lib::DHMap<unsigned_int,_unsigned_int,_Lib::IdentityHash,_Lib::DefaultHash>::~DHMap
              (&local_60._data);
  }
  RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>::unifier
            ((RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_> *)&local_30);
  Lib::SmartPtr<Indexing::ResultSubstitution>::SmartPtr(&__return_storage_ptr__->unifier,&local_30);
  __return_storage_ptr__->data = (Lhs *)this_00;
  Lib::SmartPtr<Indexing::ResultSubstitution>::~SmartPtr(&local_30);
  return __return_storage_ptr__;
}

Assistant:

QueryRes<Unifier, LeafData> next()
      {
        while(!hasLeafData() && findNextLeaf()) {}
        ASS(hasLeafData());

        ASS(!_normalizationRecording);

        auto ld = _leafData->next();
        if (_retrieveSubstitution) {
            Renaming normalizer;
            normalizer.normalizeVariables(ld->key());

            ASS(_normalizationBacktrackData.isEmpty());
            _algo.bdRecord(_normalizationBacktrackData);
            _normalizationRecording=true;

            _algo.denormalize(normalizer);
        }

        DEBUG_QUERY(1, "leaf data: ", *ld)
        return QueryRes(_algo.unifier(), ld);
      }